

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  bool bVar1;
  SQTable *this;
  SQNativeClosure *x;
  SQString *x_00;
  long in_RSI;
  SQNativeClosure *nc;
  SQTable *t;
  SQInteger i;
  SQInteger in_stack_ffffffffffffff98;
  SQSharedState *in_stack_ffffffffffffffa0;
  SQString *in_stack_ffffffffffffffa8;
  SQSharedState *in_stack_ffffffffffffffb0;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQSharedState *in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffc8;
  long local_20;
  
  local_20 = 0;
  this = SQTable::Create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  while( true ) {
    if (*(long *)(in_RSI + local_20 * 0x20) == 0) {
      return this;
    }
    x = SQNativeClosure::Create
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8.pNativeClosure,
                   (SQInteger)in_stack_ffffffffffffffb0);
    x->_nparamscheck = *(SQInteger *)(in_RSI + local_20 * 0x20 + 0x10);
    SQString::Create(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8,
                     (SQInteger)in_stack_ffffffffffffffa0);
    SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((*(long *)(in_RSI + local_20 * 0x20 + 0x18) != 0) &&
       (bVar1 = CompileTypemask((SQIntVec *)in_stack_ffffffffffffffb8.pTable,
                                (SQChar *)in_stack_ffffffffffffffb0), !bVar1)) break;
    x_00 = SQString::Create(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8,
                            (SQInteger)in_stack_ffffffffffffffa0);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,x_00);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0,x);
    SQTable::NewSlot(this,(SQObjectPtr *)x,(SQObjectPtr *)in_stack_ffffffffffffffc8.pTable);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
    local_20 = local_20 + 1;
  }
  return (SQTable *)0x0;
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}